

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

package * lsvm::object::new_package(symbol *name)

{
  long lVar1;
  long lVar2;
  package *ppVar3;
  hashmap *phVar4;
  undefined8 *puVar5;
  
  lVar1 = packages;
  if (packages == 0) {
    puVar5 = &packages;
  }
  else {
    do {
      lVar2 = lVar1;
      lVar1 = *(long *)(lVar2 + 0x10);
    } while (lVar1 != 0);
    puVar5 = (undefined8 *)(lVar2 + 0x10);
  }
  ppVar3 = (package *)memory::allocate(0x18);
  ppVar3->name = name;
  phVar4 = hashmap::new_hashmap
                     (symbol::symbol_equals,symbol::symbol_hash,'\x01','\x03',3,100,7,0x2ac5);
  ppVar3->classes = phVar4;
  *puVar5 = ppVar3;
  return ppVar3;
}

Assistant:

package* new_package(symbol* name){

    package** parent = &packages;
    if(*parent != null){
        do{
            parent = &((*parent)->next);
        }while(*parent != null);
    }

    package* pkg = (package*)lsvm::memory::allocate(sizeof(package));
    pkg->name = name;
    pkg->classes = lsvm::symbol::new_symbolmap();
    *parent = pkg;
    return pkg;    
}